

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * leftJustify(string *input,int width)

{
  uint uVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  string *str;
  allocator local_41;
  string local_40 [40];
  string *psStack_18;
  int width_local;
  string *input_local;
  
  str = (string *)CONCAT44(in_register_00000034,width);
  psStack_18 = str;
  input_local = input;
  uVar1 = utf8_text_width(str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(ulong)(in_EDX - uVar1),' ',&local_41);
  std::operator+(input,str);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return input;
}

Assistant:

std::string leftJustify (const std::string& input, const int width)
{
  return input + std::string (width - utf8_text_width (input), ' ');
}